

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix-test.cc
# Opt level: O0

void __thiscall
BufferedFileTest_MoveFromTemporaryInCtor_Test::TestBody
          (BufferedFileTest_MoveFromTemporaryInCtor_Test *this)

{
  bool bVar1;
  AssertHelper *this_00;
  Message *in_stack_00000008;
  AssertHelper *in_stack_00000010;
  AssertionResult gtest_ar;
  buffered_file f;
  FILE *fp;
  _IO_FILE **in_stack_ffffffffffffff90;
  undefined7 in_stack_ffffffffffffff98;
  undefined1 in_stack_ffffffffffffff9f;
  buffered_file *this_01;
  char *expected_expression;
  int line;
  char *in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb8;
  Type in_stack_ffffffffffffffbc;
  AssertHelper *in_stack_ffffffffffffffc0;
  AssertionResult local_28;
  buffered_file local_18;
  char local_10 [16];
  
  local_10[0] = '\0';
  local_10[1] = '\0';
  local_10[2] = '\0';
  local_10[3] = '\0';
  local_10[4] = '\0';
  local_10[5] = '\0';
  local_10[6] = '\0';
  local_10[7] = '\0';
  this_01 = &local_18;
  expected_expression = local_10;
  open_buffered_file((FILE **)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
  fmt::v5::buffered_file::get(this_01);
  testing::internal::EqHelper<false>::Compare<_IO_FILE*,_IO_FILE*>
            (expected_expression,(char *)this_01,
             (_IO_FILE **)CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98),
             in_stack_ffffffffffffff90);
  line = (int)((ulong)expected_expression >> 0x20);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_28);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffffc0);
    this_00 = (AssertHelper *)testing::AssertionResult::failure_message((AssertionResult *)0x110fe9)
    ;
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb0,line,
               (char *)this_01);
    testing::internal::AssertHelper::operator=(in_stack_00000010,in_stack_00000008);
    testing::internal::AssertHelper::~AssertHelper(this_00);
    testing::Message::~Message((Message *)0x111037);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x111077);
  fmt::v5::buffered_file::~buffered_file(this_01);
  return;
}

Assistant:

TEST(BufferedFileTest, MoveFromTemporaryInCtor) {
  FILE *fp = FMT_NULL;
  buffered_file f(open_buffered_file(&fp));
  EXPECT_EQ(fp, f.get());
}